

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser * init_parse_brand(void)

{
  parser *p_00;
  parser *p;
  
  p_00 = parser_new();
  parser_setpriv(p_00,(void *)0x0);
  parser_reg(p_00,"code str code",parse_brand_code);
  parser_reg(p_00,"name str name",parse_brand_name);
  parser_reg(p_00,"verb str verb",parse_brand_verb);
  parser_reg(p_00,"multiplier uint multiplier",parse_brand_multiplier);
  parser_reg(p_00,"o-multiplier uint multiplier",parse_brand_o_multiplier);
  parser_reg(p_00,"power uint power",parse_brand_power);
  parser_reg(p_00,"resist-flag sym flag",parse_brand_resist_flag);
  parser_reg(p_00,"vuln-flag sym flag",parse_brand_vuln_flag);
  return p_00;
}

Assistant:

static struct parser *init_parse_brand(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "code str code", parse_brand_code);
	parser_reg(p, "name str name", parse_brand_name);
	parser_reg(p, "verb str verb", parse_brand_verb);
	parser_reg(p, "multiplier uint multiplier", parse_brand_multiplier);
	parser_reg(p, "o-multiplier uint multiplier", parse_brand_o_multiplier);
	parser_reg(p, "power uint power", parse_brand_power);
	parser_reg(p, "resist-flag sym flag", parse_brand_resist_flag);
	parser_reg(p, "vuln-flag sym flag", parse_brand_vuln_flag);
	return p;
}